

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O0

void __thiscall LinePrinter::PrintOrBuffer(LinePrinter *this,char *data,size_t size)

{
  size_t size_local;
  char *data_local;
  LinePrinter *this_local;
  
  if ((this->console_locked_ & 1U) == 0) {
    fwrite(data,1,size,_stdout);
  }
  else {
    std::__cxx11::string::append((char *)&this->output_buffer_,(ulong)data);
  }
  return;
}

Assistant:

void LinePrinter::PrintOrBuffer(const char* data, size_t size) {
  if (console_locked_) {
    output_buffer_.append(data, size);
  } else {
    // Avoid printf and C strings, since the actual output might contain null
    // bytes like UTF-16 does (yuck).
    fwrite(data, 1, size, stdout);
  }
}